

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_CRT_LOCALE::Validate_sscanf(void)

{
  int iVar1;
  double a;
  double local_10;
  
  local_10 = -1.23432101234321e+308;
  iVar1 = __isoc99_sscanf(m_validation_string,m_validation_scan_format,&local_10);
  return local_10 == 12345678901234.25 && iVar1 == 1;
}

Assistant:

static bool Validate_sscanf()
  {
    // Test formatted scanning
    double a = ON_UNSET_VALUE;
    // Testing C-runtime - do not using ON_String::Scan
    int scanf_rc = sscanf(m_validation_string, m_validation_scan_format, &a);
    return ValidateDouble(a, scanf_rc);
  }